

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O1

void google::CaptureTestStderr(void)

{
  CapturedStream *this;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_48;
  LogMessage local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*fLS::FLAGS_test_tmpdir_abi_cxx11_,
             fLS::FLAGS_test_tmpdir_abi_cxx11_[1] + *fLS::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_48);
  if (_ZN6googleL18s_captured_streamsE_0 == (CapturedStream *)0x0) {
    if (g_new_hook != (code *)0x0) {
      (*g_new_hook)();
    }
    this = (CapturedStream *)malloc(0x28);
    CapturedStream::CapturedStream(this,2,&local_48);
    _ZN6googleL18s_captured_streamsE_0 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
             ,0x149);
  poVar1 = LogMessage::stream(&local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Check failed: s_captured_streams[fd] == NULL ",0x2d);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

static inline void CaptureTestStderr() {
  CaptureTestOutput(STDERR_FILENO, FLAGS_test_tmpdir + "/captured.err");
}